

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::walk
          (Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_> *this,Expression **root)

{
  pointer pTVar1;
  pointer pTVar2;
  TaskFunc p_Var3;
  Expression **ppEVar4;
  size_t sVar5;
  pointer pTVar6;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::walk(Expression *&) [SubType = Reindexer, VisitorType = wasm::Visitor<Reindexer>]"
                 );
  }
  pushTask(this,PostWalker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::scan,root);
  sVar5 = (this->stack).usedFixed;
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + sVar5 != 0) {
    do {
      pTVar1 = (this->stack).flexible.
               super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (this->stack).flexible.
               super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pTVar1 == pTVar2) {
        if (sVar5 == 0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::Task, 10>::back() [T = wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::Task, N = 10]"
                       );
        }
        pTVar6 = (pointer)&(this->stack).fixed._M_elems[sVar5 - 1].func;
      }
      else {
        pTVar6 = pTVar2 + -1;
      }
      p_Var3 = pTVar6->func;
      ppEVar4 = pTVar6->currp;
      if (pTVar1 == pTVar2) {
        if (sVar5 == 0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::Task, 10>::pop_back() [T = wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::Task, N = 10]"
                       );
        }
        (this->stack).usedFixed = sVar5 - 1;
      }
      else {
        (this->stack).flexible.
        super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar2 + -1;
      }
      this->replacep = ppEVar4;
      if (*ppEVar4 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Reindexer, wasm::Visitor<Reindexer>>::walk(Expression *&) [SubType = Reindexer, VisitorType = wasm::Visitor<Reindexer>]"
                     );
      }
      (*p_Var3)((Reindexer *)(this[-1].stack.fixed._M_elems + 7),ppEVar4);
      sVar5 = (this->stack).usedFixed;
    } while (((long)(this->stack).flexible.
                    super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->stack).flexible.
                    super__Vector_base<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task,_std::allocator<wasm::Walker<Reindexer,_wasm::Visitor<Reindexer,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) + sVar5 != 0);
  }
  return;
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }